

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall
HPresolve::getBoundOnLByZj
          (HPresolve *this,int row,int j,double *lo,double *up,double colLow,double colUpp)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double *local_80;
  
  uVar19 = (ulong)j;
  pdVar4 = (this->super_HPreData).colCostAtEl.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(this->super_HPreData).colCostAtEl.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)pdVar4 >> 3;
  uVar13 = uVar19;
  if (uVar19 < uVar8) {
    piVar5 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
    if (uVar19 < uVar8) {
      piVar6 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
      uVar8 = uVar9;
      if (uVar19 < uVar9) {
        dVar1 = pdVar4[uVar19];
        iVar3 = piVar5[uVar19];
        uVar12 = (ulong)iVar3;
        iVar10 = piVar6[uVar19];
        piVar5 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar14 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
        piVar6 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar15 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
        pdVar4 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar16 = (long)(this->super_HPreData).Avalue.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
        pdVar7 = (this->super_HPreData).valueRowDual.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar17 = (long)(this->super_HPreData).valueRowDual.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
        if (iVar10 < iVar3) {
          iVar10 = iVar3;
        }
        dVar21 = 0.0;
        uVar18 = uVar12;
        while ((long)iVar10 != uVar18) {
          if (uVar14 <= uVar18) {
            uVar8 = uVar14;
            uVar13 = uVar12;
            if (uVar12 < uVar14) {
              uVar13 = uVar14;
            }
            goto LAB_00149993;
          }
          uVar11 = (ulong)piVar5[uVar18];
          uVar8 = uVar15;
          uVar13 = uVar11;
          if (uVar15 <= uVar11) goto LAB_00149993;
          if (piVar6[uVar11] != 0) {
            uVar8 = uVar16;
            uVar13 = uVar18;
            if ((uVar16 <= uVar18) || (uVar8 = uVar17, uVar13 = uVar11, uVar17 <= uVar11))
            goto LAB_00149993;
            dVar21 = dVar21 + pdVar4[uVar18] * pdVar7[uVar11];
          }
          uVar18 = uVar18 + 1;
          uVar8 = uVar9;
          uVar13 = uVar19;
          if (uVar9 <= uVar19) goto LAB_00149993;
        }
        dVar20 = HPreData::getaij(&this->super_HPreData,row,j);
        dVar2 = this->tol;
        if (ABS(colLow - colUpp) < dVar2) {
          return;
        }
        pdVar4 = (this->super_HPreData).valuePrimal.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar8 = (long)(this->super_HPreData).valuePrimal.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
        uVar13 = uVar19;
        if (uVar19 < uVar8) {
          dVar21 = (-dVar1 - dVar21) / dVar20;
          dVar1 = pdVar4[uVar19];
          if ((dVar1 - colLow <= dVar2) || (colUpp - dVar1 <= dVar2)) {
            if (0.0 <= dVar20) {
LAB_001498eb:
              if ((dVar20 <= 0.0) || ((dVar1 != colUpp || (NAN(dVar1) || NAN(colUpp))))) {
                if ((dVar20 <= 0.0 || colLow != dVar1) && (0.0 <= dVar20 || dVar1 != colUpp)) {
                  return;
                }
                goto LAB_001498cc;
              }
            }
            else if ((dVar1 != colLow) || (NAN(dVar1) || NAN(colLow))) goto LAB_001498eb;
            local_80 = up;
            if (*up <= dVar21) {
              return;
            }
          }
          else {
            if (dVar21 < *up) {
              *up = dVar21;
            }
LAB_001498cc:
            local_80 = lo;
            if (dVar21 < *lo || dVar21 == *lo) {
              return;
            }
          }
          *local_80 = dVar21;
          return;
        }
      }
    }
  }
LAB_00149993:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13,
             uVar8);
}

Assistant:

void HPresolve::getBoundOnLByZj(int row, int j, double* lo, double* up, double colLow, double colUpp) {

	double cost = colCostAtEl.at(j);//valueColDual.at(j);
	double x = -cost;

	double sum = 0;
	for (int kk=Astart.at(j); kk<Aend.at(j);++kk)
		if (flagRow.at(Aindex.at(kk))) {
			sum = sum + Avalue.at(kk)*valueRowDual.at(Aindex.at(kk));
		}
	x = x - sum;

	double aij=getaij(row,j);
	x = x/aij;


	if (abs(colLow-colUpp) < tol)
		return; //here there is no restriction on zj so no bound on y

	if ((valuePrimal.at(j) - colLow) > tol && (colUpp - valuePrimal.at(j)) > tol) {
		//set both bounds
		if (x<*up)
			*up = x;
		if (x>*lo)
			*lo = x;
	}

	else if ((valuePrimal.at(j) == colLow && aij<0) || (valuePrimal.at(j) == colUpp && aij>0)) {
		if (x<*up)
			*up = x;
	}
	else if ((valuePrimal.at(j) == colLow && aij>0) || (valuePrimal.at(j) == colUpp && aij<0)) {
		if (x>*lo)
			*lo = x;
	}
}